

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnp::_::ConstData<3ul>const&>
          (String *__return_storage_ptr__,kj *this,ConstData<3UL> *params)

{
  kj *this_00;
  ConstData<3UL> *value;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *params_00;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_50;
  kj *local_18;
  ConstData<3UL> *params_local;
  
  local_18 = this;
  params_local = (ConstData<3UL> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnp::_::ConstData<3ul>const&>((ConstData<3UL> *)this);
  toCharSequence<capnp::_::ConstData<3ul>const&>(&local_50,this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<const_unsigned_char>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}